

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(void)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  char (*pacVar5) [8];
  char *pcVar6;
  long lVar7;
  char *__s;
  EVP_PKEY_CTX *ctx;
  long lVar8;
  char *__s_00;
  char c;
  int local_9c;
  char s [100];
  
  puts("\nREVERSI");
  do {
    puts("You can enter 0 to go first, 1 for AI to go first");
    __isoc99_scanf("%c",&c);
    if (c == '0') {
      pcVar6 = "I will be black - (X).";
      __s_00 = "You will be white - (O)";
      __s = "You can go first on the first game, then we will take turns.";
      AI_COLOR = 4;
      goto LAB_00101ca7;
    }
  } while (c != '1');
  pcVar6 = "You will be black - (X).";
  __s_00 = "I will be white - (O)";
  __s = "I will go first on the first game, then we will take turns.";
  AI_COLOR = 5;
LAB_00101ca7:
  puts(__s);
  puts(__s_00);
  puts(pcVar6);
  clean_stdin();
  puts("Select a square for your move by typing a digit for the row");
  printf("and a letter for the column with no spaces between.");
  puts("\nGood luck! Press Enter to start.");
  do {
    iVar3 = getchar();
  } while (iVar3 != 10);
LAB_00101d20:
  do {
    puts("You can choose the difficulty for the game.");
    puts("Easy   - 0");
    puts("Normal - 1");
    puts("Hard   - 2");
    puts("Hell   - 3");
    __isoc99_scanf("%c");
    bVar2 = c - 0x30;
  } while (3 < bVar2);
  ctx = (EVP_PKEY_CTX *)(&DAT_00102030 + *(int *)(&DAT_00102030 + (ulong)bVar2 * 4));
  MODE = (int)bVar2;
  puts((char *)ctx);
  clean_stdin();
  init(ctx);
LAB_00101d9b:
  bVar1 = false;
  iVar3 = 0;
  if (AI_COLOR == 4) {
    iVar3 = runAI();
  }
  pacVar5 = chessboard;
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
    lVar8 = 0;
    do {
      if (lVar8 == 8) goto LAB_00101df3;
      pcVar6 = *pacVar5 + lVar8;
    } while ((*pcVar6 != 3) && (lVar8 = lVar8 + 1, 6 - AI_COLOR != (int)*pcVar6));
    bVar1 = true;
LAB_00101df3:
    pacVar5 = pacVar5 + 1;
  }
  local_9c = iVar3;
  if (bVar1) {
    do {
      s[0x50] = '\0';
      s[0x51] = '\0';
      s[0x52] = '\0';
      s[0x53] = '\0';
      s[0x54] = '\0';
      s[0x55] = '\0';
      s[0x56] = '\0';
      s[0x57] = '\0';
      s[0x58] = '\0';
      s[0x59] = '\0';
      s[0x5a] = '\0';
      s[0x5b] = '\0';
      s[0x5c] = '\0';
      s[0x5d] = '\0';
      s[0x5e] = '\0';
      s[0x5f] = '\0';
      s[0x40] = '\0';
      s[0x41] = '\0';
      s[0x42] = '\0';
      s[0x43] = '\0';
      s[0x44] = '\0';
      s[0x45] = '\0';
      s[0x46] = '\0';
      s[0x47] = '\0';
      s[0x48] = '\0';
      s[0x49] = '\0';
      s[0x4a] = '\0';
      s[0x4b] = '\0';
      s[0x4c] = '\0';
      s[0x4d] = '\0';
      s[0x4e] = '\0';
      s[0x4f] = '\0';
      s[0x30] = '\0';
      s[0x31] = '\0';
      s[0x32] = '\0';
      s[0x33] = '\0';
      s[0x34] = '\0';
      s[0x35] = '\0';
      s[0x36] = '\0';
      s[0x37] = '\0';
      s[0x38] = '\0';
      s[0x39] = '\0';
      s[0x3a] = '\0';
      s[0x3b] = '\0';
      s[0x3c] = '\0';
      s[0x3d] = '\0';
      s[0x3e] = '\0';
      s[0x3f] = '\0';
      s[0x20] = '\0';
      s[0x21] = '\0';
      s[0x22] = '\0';
      s[0x23] = '\0';
      s[0x24] = '\0';
      s[0x25] = '\0';
      s[0x26] = '\0';
      s[0x27] = '\0';
      s[0x28] = '\0';
      s[0x29] = '\0';
      s[0x2a] = '\0';
      s[0x2b] = '\0';
      s[0x2c] = '\0';
      s[0x2d] = '\0';
      s[0x2e] = '\0';
      s[0x2f] = '\0';
      s[0x10] = '\0';
      s[0x11] = '\0';
      s[0x12] = '\0';
      s[0x13] = '\0';
      s[0x14] = '\0';
      s[0x15] = '\0';
      s[0x16] = '\0';
      s[0x17] = '\0';
      s[0x18] = '\0';
      s[0x19] = '\0';
      s[0x1a] = '\0';
      s[0x1b] = '\0';
      s[0x1c] = '\0';
      s[0x1d] = '\0';
      s[0x1e] = '\0';
      s[0x1f] = '\0';
      s[0] = '\0';
      s[1] = '\0';
      s[2] = '\0';
      s[3] = '\0';
      s[4] = '\0';
      s[5] = '\0';
      s[6] = '\0';
      s[7] = '\0';
      s[8] = '\0';
      s[9] = '\0';
      s[10] = '\0';
      s[0xb] = '\0';
      s[0xc] = '\0';
      s[0xd] = '\0';
      s[0xe] = '\0';
      s[0xf] = '\0';
      s[0x60] = '\0';
      s[0x61] = '\0';
      s[0x62] = '\0';
      s[99] = '\0';
      printf("Please enter your move (row column- no space):");
      __isoc99_scanf("%s",s);
      clean_stdin();
      sVar4 = strlen(s);
      if (sVar4 == 2) {
        if (0xf7 < (byte)(s[1] + 0x97U) && 0xf7 < (byte)(s[0] - 0x39U)) {
          if ((chessboard[(byte)(s[0] - 0x31U)][(byte)(s[1] + 0x9fU)] == 3) ||
             (6 - AI_COLOR == (int)chessboard[(byte)(s[0] - 0x31U)][(byte)(s[1] + 0x9fU)]))
          goto LAB_00101eaa;
        }
      }
      puts("Not a valid move, try again.");
    } while( true );
  }
  goto LAB_00101ec0;
LAB_00101eaa:
  putchess((uint)(byte)(s[0] - 0x31U),(uint)(byte)(s[1] + 0x9fU),9 - AI_COLOR);
  refresh();
LAB_00101ec0:
  if (AI_COLOR == 5) {
    local_9c = runAI();
  }
  iVar3 = gameover();
  if (iVar3 == 0) {
    if (bVar1) {
      if (local_9c == 0) {
        puts("AI have to pass. You will go.");
      }
    }
    else {
      puts("You have to pass. Press enter.");
      do {
        iVar3 = getchar();
      } while (iVar3 != 10);
    }
    goto LAB_00101d9b;
  }
  puts("\nDo you want to play again?(y/n)");
  while( true ) {
    iVar3 = getchar();
    c = (char)iVar3;
    clean_stdin();
    if ((c & 0xdfU) == 0x59) break;
    if ((c & 0xdfU) == 0x4e) {
      puts("\nGoodbye!");
      getchar();
      return 0;
    }
  }
  goto LAB_00101d20;
}

Assistant:

int main() {
    char c;
    printf("\nREVERSI\n");
/*#ifdef AI_COLOR_BLACK
	printf("You can go first on the first game, then we will take turns.\n");
#endif
#ifdef AI_COLOR_WHITE
	printf("I will go first on the first game, then we will take turns.\n");
#endif*/
    while (1) {
        printf("You can enter 0 to go first, 1 for AI to go first\n");
        scanf("%c", &c);
        if (c == '0') {
            AI_COLOR = WHITE;
            printf("You can go first on the first game, then we will take turns.\n");
            printf("You will be white - (O)\n");
            printf("I will be black - (X).\n");
            break;
        } else if (c == '1') {
            AI_COLOR = BLACK;
            printf("I will go first on the first game, then we will take turns.\n");
            printf("I will be white - (O)\n");
            printf("You will be black - (X).\n");
            break;
        }
    }
    clean_stdin();

    printf("Select a square for your move by typing a digit for the row\n");
    printf("and a letter for the column with no spaces between.");
    printf("\nGood luck! Press Enter to start.\n");
    while (getchar() != '\n') {}

    while (1) {
        while (1) {
            printf("You can choose the difficulty for the game.\n");
            printf("Easy   - 0\n");
            printf("Normal - 1\n");
            printf("Hard   - 2\n");
            printf("Hell   - 3\n");
            scanf("%c", &c);
            if (c == '0') {
                MODE = MODE_EASY;
                printf("You choose the easy mode\n\n");
                break;
            } else if (c == '1') {
                MODE = MODE_NORM;
                printf("You choose the normal mode\n\n");
                break;
            } else if (c == '2') {
                MODE = MODE_HARD;
                printf("You choose the hard mode\n\n");
                break;
            } else if (c == '3') {
                MODE = MODE_HELL;
                printf("You choose the hell mode\n\n");
                break;
            }
        }
        clean_stdin();
        init();
        int i, j;
        while (1) {
            int player_move = 0, ai_move = 0;

            if (AI_COLOR == WHITE) {
                ai_move = runAI();
            }

/*#ifdef AI_COLOR_WHITE
			ai_move = runAI();
#endif*/

            for (i = 0; i < SIZE; i++) {
                for (j = 0; j < SIZE; j++) {
                    if (chessboard[i][j] == COLOR_(COLOR_rev(AI_COLOR)) || chessboard[i][j] == BOTH)
/*#ifdef AI_COLOR_BLACK
					if (chessboard[i][j] == WHITE_ || chessboard[i][j] == BOTH)
#endif
#ifdef AI_COLOR_WHITE
					if (chessboard[i][j] == BLACK_ || chessboard[i][j] == BOTH)
#endif*/
                    {
                        player_move = 1;
                        break;
                    }
                }
            }

            while (player_move) {

                char s[100] = {0};
                printf("Please enter your move (row column- no space):");
                scanf("%s", s);
                clean_stdin();
                if (strlen(s) != 2) {
                    printf("Not a valid move, try again.\n");
                    continue;
                }
                int x = s[0] - '1';
                int y = s[1] - 'a';
                if (x < 0 || x >= SIZE || y < 0 || y >= SIZE) {
                    printf("Not a valid move, try again.\n");
                    continue;
                }

                if (chessboard[x][y] != COLOR_(COLOR_rev(AI_COLOR)) && chessboard[x][y] != BOTH)
/*#ifdef AI_COLOR_BLACK
				if (chessboard[x][y] != WHITE_&&chessboard[x][y] != BOTH)
#endif
#ifdef AI_COLOR_WHITE
				if (chessboard[x][y] != BLACK_&&chessboard[x][y] != BOTH)
#endif*/
                {
                    printf("Not a valid move, try again.\n");
                    continue;
                }

                putchess(x, y, COLOR_rev(AI_COLOR));

/*#ifdef AI_COLOR_BLACK
				putchess(x, y, WHITE);
#endif
#ifdef AI_COLOR_WHITE
				putchess(x, y, BLACK);
#endif*/
                refresh();
                break;
            }

            if (AI_COLOR == BLACK) {
                ai_move = runAI();
            }
/*#ifdef AI_COLOR_BLACK
			ai_move = runAI();
#endif*/

            if (gameover() == 1) {
                break;
            } else if (player_move == 0) {
                printf("You have to pass. Press enter.\n");
                while (getchar() != '\n') {}
            } else if (ai_move == 0) {
                printf("AI have to pass. You will go.\n");
            }
        }
        printf("\nDo you want to play again?(y/n)\n");
        while (1) {
            c = getchar();
            clean_stdin();
            if (c == 'Y' || c == 'y') {
                break;
            } else if (c == 'N' || c == 'n') {
                printf("\nGoodbye!\n");
                getchar();
                return 0;
            }
        }
    }
    return 0;
}